

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

int __thiscall actorpp::detail::ChannelImpl<int>::pop(ChannelImpl<int> *this)

{
  int iVar1;
  bool bVar2;
  element_type *__m;
  logic_error *this_00;
  reference pvVar3;
  int element;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  ChannelImpl<int> *this_local;
  
  lock._8_8_ = this;
  __m = std::
        __shared_ptr_access<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&__m->mut);
  bVar2 = readable_with_lock(this);
  if (!bVar2) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"called pop() on unreadable channel");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pvVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->elements);
  iVar1 = *pvVar3;
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->elements);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return iVar1;
}

Assistant:

T pop() {
    std::unique_lock<std::mutex> lock(actor_impl->mut);
    if (!readable_with_lock())
      throw std::logic_error("called pop() on unreadable channel");
    T element = std::move(elements.front());
    elements.pop();
    return element;
  }